

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_client_program.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  error_category *peVar2;
  undefined4 extraout_var;
  size_t sVar3;
  ostream *this;
  char local_9;
  char *__s;
  
  peVar2 = boost::system::system_category();
  iVar1 = (*peVar2->_vptr_error_category[2])(peVar2);
  __s = (char *)CONCAT44(extraout_var,iVar1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106090);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
  }
  local_9 = ':';
  this = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_9,1);
  std::ostream::operator<<(this,0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(void)
{
  boost::system::error_code ec;
  std::cout << ec << std::endl;
  return 0;
}